

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_ConvertSignatureFromDer_Test::TestBody(CryptoUtil_ConvertSignatureFromDer_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  AssertHelper local_e8;
  Message local_e0;
  string local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_90 [8];
  ByteData signature;
  SigHashType sig_type;
  string hex_sig;
  allocator local_31;
  undefined1 local_30 [8];
  string der_sig;
  CryptoUtil_ConvertSignatureFromDer_Test *this_local;
  
  der_sig.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "30440220773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca4702201907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b2422601"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&sig_type.is_anyone_can_pay_,
             "773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca471907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b24226"
             ,(allocator *)((long)&sig_type.hash_algorithm_ + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sig_type.hash_algorithm_ + 3));
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)
             &signature.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar.message_,(string *)local_30);
  cfd::core::CryptoUtil::ConvertSignatureFromDer
            ((ByteData *)local_90,(ByteData *)&gtest_ar.message_,
             (SigHashType *)
             &signature.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d8,(ByteData *)local_90);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b8,"signature.GetHex().c_str()","hex_sig.c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x222,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  cfd::core::ByteData::~ByteData((ByteData *)local_90);
  std::__cxx11::string::~string((string *)&sig_type.is_anyone_can_pay_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(CryptoUtil, ConvertSignatureFromDer) {
  std::string der_sig = "30440220773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca4702201907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b2422601";
  std::string hex_sig = "773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca471907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b24226";
  SigHashType sig_type;
  ByteData signature = CryptoUtil::ConvertSignatureFromDer(ByteData(der_sig), &sig_type);
  EXPECT_STREQ(signature.GetHex().c_str(), hex_sig.c_str());
}